

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

DWORD __thiscall TSparseArray::FindGroup_Items1(TSparseArray *this,DWORD index)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  _BASEVALS *p_Var4;
  DWORD middleValue;
  DWORD nextValue;
  DWORD startValue;
  DWORD groupIndex;
  DWORD index_local;
  TSparseArray *this_local;
  
  puVar3 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem1,(ulong)(index >> 9));
  middleValue = *puVar3 >> 9;
  puVar3 = TGenericArray<unsigned_int>::operator[](&this->IndexToItem1,(ulong)((index >> 9) + 1));
  uVar1 = *puVar3 + 0x1ff >> 9;
  if (uVar1 - middleValue < 10) {
    while (p_Var4 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)(middleValue + 1)),
          uVar2 = middleValue, p_Var4->BaseValue200 <= index) {
      middleValue = middleValue + 1;
    }
  }
  else {
    uVar2 = middleValue;
    if (middleValue + 1 < uVar1) {
      uVar2 = uVar1 + middleValue >> 1;
      p_Var4 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,(ulong)uVar2);
      if (index < p_Var4->BaseValue200) {
        uVar2 = middleValue;
      }
    }
  }
  middleValue = uVar2;
  return middleValue;
}

Assistant:

DWORD FindGroup_Items1(DWORD index)
    {
        DWORD groupIndex = (index >> 0x09);
        DWORD startValue = IndexToItem1[groupIndex] >> 9;
        DWORD nextValue = (IndexToItem1[groupIndex + 1] + 0x1FF) >> 9;

        // Find the BASEVALS structure which the start index belongs to
        // For less than 10 values, use sequential search. Otherwise, use binary search
        if ((nextValue - startValue) < 10)
        {
            // HOTS: 01959F94
            while (index >= BaseVals[startValue + 1].BaseValue200)
            {
                // HOTS: 1959FA3
                startValue++;
            }
        }
        else
        {
            // Binary search (HOTS: 1959FAD)
            if ((startValue + 1) < nextValue)
            {
                // HOTS: 1959FB4
                DWORD middleValue = (nextValue + startValue) >> 1;

                if (index < BaseVals[middleValue].BaseValue200)
                {
                    // HOTS: 1959FC4
                    nextValue = middleValue;
                }
                else
                {
                    // HOTS: 1959FC8
                    startValue = middleValue;
                }
            }
        }

        return startValue;
    }